

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O0

string * __thiscall
TgBot::HttpParser::generateMultipartBoundary_abi_cxx11_
          (string *__return_storage_ptr__,HttpParser *this,
          vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args)

{
  bool bVar1;
  byte bVar2;
  time_t tVar3;
  size_t extraout_RDX;
  size_t length;
  undefined1 auVar4 [16];
  string local_68;
  reference local_48;
  HttpReqArg *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *__range1;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args_local;
  HttpParser *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  __end1 = std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::begin(args);
  item = (HttpReqArg *)std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::end(args)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_TgBot::HttpReqArg_*,_std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>_>
                                     *)&item), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_TgBot::HttpReqArg_*,_std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>_>
               ::operator*(&__end1);
    if ((local_48->isFile & 1U) != 0) {
      while( true ) {
        bVar2 = std::__cxx11::string::empty();
        bVar1 = true;
        length = extraout_RDX;
        if ((bVar2 & 1) == 0) {
          auVar4 = std::__cxx11::string::find
                             ((string *)&local_48->value,(ulong)__return_storage_ptr__);
          length = auVar4._8_8_;
          bVar1 = auVar4._0_8_ != -1;
        }
        if (!bVar1) break;
        StringTools::generateRandomString_abi_cxx11_(&local_68,(StringTools *)0x4,length);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_TgBot::HttpReqArg_*,_std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

string HttpParser::generateMultipartBoundary(const vector<HttpReqArg>& args) const {
    string result;
    srand((uint32_t) time(nullptr));
    for (const HttpReqArg& item : args) {
        if (item.isFile) {
            while (result.empty() || item.value.find(result) != string::npos) {
                result += StringTools::generateRandomString(4);
            }
        }
    }
    return result;
}